

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O0

Value * __thiscall Json::Value::operator[](Value *this,ArrayIndex index)

{
  bool bVar1;
  ValueType VVar2;
  reference ppVar3;
  iterator local_1f8;
  _Rb_tree_const_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_> local_1f0;
  iterator local_1e8;
  _Rb_tree_const_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_> local_1e0;
  const_iterator it;
  CZString key;
  ostringstream local_198 [8];
  OStringStream oss;
  ArrayIndex index_local;
  Value *this_local;
  
  VVar2 = type(this);
  if (VVar2 != nullValue) {
    VVar2 = type(this);
    if (VVar2 != arrayValue) {
      std::__cxx11::ostringstream::ostringstream(local_198);
      std::operator<<((ostream *)local_198,
                      "in Json::Value::operator[](ArrayIndex)const: requires arrayValue");
      std::__cxx11::ostringstream::str();
      throwLogicError((String *)&key.field_1.storage_);
    }
  }
  VVar2 = type(this);
  if (VVar2 == nullValue) {
    this_local = nullSingleton();
  }
  else {
    CZString::CZString((CZString *)&it,index);
    local_1e8._M_node =
         (_Base_ptr)
         std::
         map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
         ::find((this->value_).map_,(CZString *)&it);
    std::_Rb_tree_const_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_>::
    _Rb_tree_const_iterator(&local_1e0,&local_1e8);
    local_1f8._M_node =
         (_Base_ptr)
         std::
         map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
         ::end((this->value_).map_);
    std::_Rb_tree_const_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_>::
    _Rb_tree_const_iterator(&local_1f0,&local_1f8);
    bVar1 = std::operator==(&local_1e0,&local_1f0);
    if (bVar1) {
      this_local = nullSingleton();
    }
    else {
      ppVar3 = std::_Rb_tree_const_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_>::
               operator*(&local_1e0);
      this_local = &ppVar3->second;
    }
    CZString::~CZString((CZString *)&it);
  }
  return this_local;
}

Assistant:

const Value& Value::operator[](ArrayIndex index) const {
  JSON_ASSERT_MESSAGE(
      type() == nullValue || type() == arrayValue,
      "in Json::Value::operator[](ArrayIndex)const: requires arrayValue");
  if (type() == nullValue)
    return nullSingleton();
  CZString key(index);
  ObjectValues::const_iterator it = value_.map_->find(key);
  if (it == value_.map_->end())
    return nullSingleton();
  return (*it).second;
}